

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O0

void EmitUncompressedMetaBlock
               (uint8_t *begin,uint8_t *end,size_t storage_ix_start,size_t *storage_ix,
               uint8_t *storage)

{
  size_t len_00;
  size_t *in_RCX;
  size_t in_RDX;
  long in_RSI;
  void *in_RDI;
  uint8_t *in_R8;
  size_t len;
  
  len_00 = in_RSI - (long)in_RDI;
  RewindBitPosition(in_RDX,in_RCX,in_R8);
  BrotliStoreMetaBlockHeader(len_00,1,in_RCX,in_R8);
  *in_RCX = *in_RCX + 7 & 0xfffffff8;
  memcpy(in_R8 + (*in_RCX >> 3),in_RDI,len_00);
  *in_RCX = len_00 * 8 + *in_RCX;
  in_R8[*in_RCX >> 3] = '\0';
  return;
}

Assistant:

static void EmitUncompressedMetaBlock(const uint8_t* begin, const uint8_t* end,
                                      const size_t storage_ix_start,
                                      size_t* storage_ix, uint8_t* storage) {
  const size_t len = (size_t)(end - begin);
  RewindBitPosition(storage_ix_start, storage_ix, storage);
  BrotliStoreMetaBlockHeader(len, 1, storage_ix, storage);
  *storage_ix = (*storage_ix + 7u) & ~7u;
  memcpy(&storage[*storage_ix >> 3], begin, len);
  *storage_ix += len << 3;
  storage[*storage_ix >> 3] = 0;
}